

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::setBlendMode(GLEngine *this,BlendMode newMode)

{
  undefined4 in_ESI;
  
  switch(in_ESI) {
  case 0:
    (*glad_glEnable)(0xbe2);
    (*glad_glBlendFunc)(0x302,0x303);
    break;
  case 1:
    (*glad_glEnable)(0xbe2);
    (*glad_glBlendFuncSeparate)(0x302,0x303,0x305,1);
    break;
  case 2:
    (*glad_glEnable)(0xbe2);
    (*glad_glBlendFuncSeparate)(0x302,0x303,0,1);
    break;
  case 3:
    (*glad_glEnable)(0xbe2);
    (*glad_glBlendFunc)(0x305,1);
    break;
  case 4:
    (*glad_glEnable)(0xbe2);
    (*glad_glBlendFunc)(0,0);
    break;
  case 5:
    (*glad_glEnable)(0xbe2);
    (*glad_glBlendFuncSeparate)(0x302,1,1,1);
    break;
  case 6:
    (*glad_glEnable)(0xbe2);
    (*glad_glBlendFunc)(0x302,0);
    break;
  case 7:
    (*glad_glDisable)(0xbe2);
    (*glad_glBlendFunc)(0x302,0x303);
  }
  return;
}

Assistant:

void GLEngine::setBlendMode(BlendMode newMode) {
  switch (newMode) {
  case BlendMode::Over:
    glEnable(GL_BLEND);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    break;
  case BlendMode::AlphaOver:
    glEnable(GL_BLEND);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ONE_MINUS_DST_ALPHA, GL_ONE);
    break;
  case BlendMode::OverNoWrite:
    glEnable(GL_BLEND);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ZERO, GL_ONE);
    break;
  case BlendMode::Under:
    glEnable(GL_BLEND);
    glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ONE);
    break;
  case BlendMode::Zero:
    glEnable(GL_BLEND);
    glBlendFunc(GL_ZERO, GL_ZERO);
    break;
  case BlendMode::WeightedAdd:
    glEnable(GL_BLEND);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE, GL_ONE, GL_ONE);
    break;
  case BlendMode::Source:
    glEnable(GL_BLEND);
    glBlendFunc(GL_SRC_ALPHA, GL_ZERO);
    break;
  case BlendMode::Disable:
    glDisable(GL_BLEND);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA); // doesn't actually matter
    break;
  }
}